

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O3

void bitrv216neg(double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = a[0xe];
  dVar2 = a[0xf];
  dVar3 = a[2];
  dVar4 = a[3];
  dVar5 = a[6];
  dVar6 = a[7];
  dVar7 = a[10];
  dVar8 = a[0xb];
  dVar9 = a[0xc];
  dVar10 = a[0xd];
  a[6] = a[0x16];
  a[7] = a[0x17];
  a[10] = a[0x1a];
  a[0xb] = a[0x1b];
  a[0xe] = a[0x12];
  a[0xf] = a[0x13];
  a[2] = a[0x1e];
  a[3] = a[0x1f];
  a[0x12] = a[0x1c];
  a[0x13] = a[0x1d];
  a[0xc] = dVar7;
  a[0xd] = dVar8;
  dVar7 = a[0x14];
  dVar8 = a[0x15];
  a[0x14] = dVar9;
  a[0x15] = dVar10;
  a[0x16] = dVar7;
  a[0x17] = dVar8;
  dVar7 = a[4];
  dVar8 = a[5];
  a[4] = dVar1;
  a[5] = dVar2;
  dVar1 = a[0x18];
  dVar2 = a[0x19];
  a[0x18] = dVar7;
  a[0x19] = dVar8;
  a[0x1a] = dVar1;
  a[0x1b] = dVar2;
  dVar1 = a[8];
  dVar2 = a[9];
  a[8] = dVar5;
  a[9] = dVar6;
  a[0x1c] = dVar1;
  a[0x1d] = dVar2;
  dVar1 = a[0x10];
  dVar2 = a[0x11];
  a[0x10] = dVar3;
  a[0x11] = dVar4;
  a[0x1e] = dVar1;
  a[0x1f] = dVar2;
  return;
}

Assistant:

void bitrv216neg(FFTFLT *a)
{
    FFTFLT x1r, x1i, x2r, x2i, x3r, x3i, x4r, x4i,
        x5r, x5i, x6r, x6i, x7r, x7i, x8r, x8i,
        x9r, x9i, x10r, x10i, x11r, x11i, x12r, x12i,
        x13r, x13i, x14r, x14i, x15r, x15i;

    x1r = a[2];
    x1i = a[3];
    x2r = a[4];
    x2i = a[5];
    x3r = a[6];
    x3i = a[7];
    x4r = a[8];
    x4i = a[9];
    x5r = a[10];
    x5i = a[11];
    x6r = a[12];
    x6i = a[13];
    x7r = a[14];
    x7i = a[15];
    x8r = a[16];
    x8i = a[17];
    x9r = a[18];
    x9i = a[19];
    x10r = a[20];
    x10i = a[21];
    x11r = a[22];
    x11i = a[23];
    x12r = a[24];
    x12i = a[25];
    x13r = a[26];
    x13i = a[27];
    x14r = a[28];
    x14i = a[29];
    x15r = a[30];
    x15i = a[31];
    a[2] = x15r;
    a[3] = x15i;
    a[4] = x7r;
    a[5] = x7i;
    a[6] = x11r;
    a[7] = x11i;
    a[8] = x3r;
    a[9] = x3i;
    a[10] = x13r;
    a[11] = x13i;
    a[12] = x5r;
    a[13] = x5i;
    a[14] = x9r;
    a[15] = x9i;
    a[16] = x1r;
    a[17] = x1i;
    a[18] = x14r;
    a[19] = x14i;
    a[20] = x6r;
    a[21] = x6i;
    a[22] = x10r;
    a[23] = x10i;
    a[24] = x2r;
    a[25] = x2i;
    a[26] = x12r;
    a[27] = x12i;
    a[28] = x4r;
    a[29] = x4i;
    a[30] = x8r;
    a[31] = x8i;
}